

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidDeconvolution(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ConvolutionLayerParams *this_02;
  WeightParams *pWVar5;
  ostream *poVar6;
  undefined1 local_c8 [8];
  Result res;
  int i_1;
  int i;
  ConvolutionLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  int nGroups;
  int kernel_width;
  int kernel_height;
  int kernel_channels;
  int output_channels;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&kernel_channels);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&kernel_channels);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&kernel_channels);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&kernel_channels);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(this_01);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels(this_02,5);
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels(this_02,3);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_02,2);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_02,5);
  CoreML::Specification::ConvolutionLayerParams::set_hasbias(this_02,true);
  CoreML::Specification::ConvolutionLayerParams::set_isdeconvolution(this_02,true);
  CoreML::Specification::ConvolutionLayerParams::add_outputshape(this_02,0x6e);
  CoreML::Specification::ConvolutionLayerParams::add_outputshape(this_02,0x6e);
  CoreML::Specification::ConvolutionLayerParams::mutable_valid(this_02);
  for (res.m_message.field_2._12_4_ = 0; (int)res.m_message.field_2._12_4_ < 0x96;
      res.m_message.field_2._12_4_ = res.m_message.field_2._12_4_ + 1) {
    pWVar5 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
  }
  for (res.m_message.field_2._8_4_ = 0; (int)res.m_message.field_2._8_4_ < 5;
      res.m_message.field_2._8_4_ = res.m_message.field_2._8_4_ + 1) {
    pWVar5 = CoreML::Specification::ConvolutionLayerParams::mutable_bias(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar5,1.0);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_c8,(Model *)&kernel_channels);
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x634);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)&kernel_channels);
  return m1._oneof_case_[0];
}

Assistant:

int testValidDeconvolution() {

    Specification::Model m1;

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    params->set_isdeconvolution(true);
    params->add_outputshape(110);
    params->add_outputshape(110);

    (void)params->mutable_valid();

    for (int i = 0; i < output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    // Not specifying the right number of weights should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}